

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GenerateFrameworkInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,char *fname)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  allocator local_1e5;
  cmNewLineStyle local_1e4;
  string inFile;
  ScopePushPop varScope;
  string inMod;
  
  std::__cxx11::string::string((string *)&inMod,"MACOSX_FRAMEWORK_INFO_PLIST",(allocator *)&inFile);
  pcVar2 = cmGeneratorTarget::GetProperty(target,&inMod);
  std::__cxx11::string::~string((string *)&inMod);
  if (pcVar2 == (char *)0x0) {
    pcVar5 = "MacOSXFrameworkInfo.plist.in";
  }
  else {
    pcVar5 = "MacOSXFrameworkInfo.plist.in";
    if (*pcVar2 != '\0') {
      pcVar5 = pcVar2;
    }
  }
  std::__cxx11::string::string((string *)&inFile,pcVar5,(allocator *)&inMod);
  bVar1 = cmsys::SystemTools::FileIsFullPath(inFile._M_dataplus._M_p);
  if (!bVar1) {
    cmMakefile::GetModulesFile_abi_cxx11_(&inMod,this->Makefile,inFile._M_dataplus._M_p);
    if (inMod._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&inFile);
    }
    std::__cxx11::string::~string((string *)&inMod);
  }
  bVar1 = cmsys::SystemTools::FileExists(inFile._M_dataplus._M_p,true);
  if (bVar1) {
    this_00 = this->Makefile;
    varScope.Makefile = this_00;
    cmMakefile::PushScope(this_00);
    std::__cxx11::string::string((string *)&inMod,"MACOSX_FRAMEWORK_NAME",&local_1e5);
    cmMakefile::AddDefinition(this_00,&inMod,(targetName->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string((string *)&inMod,"MACOSX_FRAMEWORK_ICON_FILE",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string((string *)&inMod,"MACOSX_FRAMEWORK_IDENTIFIER",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_FRAMEWORK_SHORT_VERSION_STRING",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string((string *)&inMod,"MACOSX_FRAMEWORK_BUNDLE_VERSION",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    cmNewLineStyle::cmNewLineStyle(&local_1e4);
    cmMakefile::ConfigureFile(this_00,inFile._M_dataplus._M_p,fname,false,false,false,local_1e4);
    cmMakefile::ScopePushPop::~ScopePushPop(&varScope);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&inMod);
    poVar3 = std::operator<<((ostream *)&inMod,"Target ");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," Info.plist template \"");
    poVar3 = std::operator<<(poVar3,(string *)&inFile);
    std::operator<<(poVar3,"\" could not be found.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)varScope.Makefile,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)&varScope);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inMod);
  }
  std::__cxx11::string::~string((string *)&inFile);
  return;
}

Assistant:

void cmLocalGenerator::GenerateFrameworkInfoPList(
  cmGeneratorTarget* target, const std::string& targetName, const char* fname)
{
  // Find the Info.plist template.
  const char* in = target->GetProperty("MACOSX_FRAMEWORK_INFO_PLIST");
  std::string inFile = (in && *in) ? in : "MacOSXFrameworkInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile.c_str())) {
    std::string inMod = this->Makefile->GetModulesFile(inFile.c_str());
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile.c_str(), true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str().c_str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_FRAMEWORK_NAME", targetName.c_str());
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_BUNDLE_VERSION");
  mf->ConfigureFile(inFile.c_str(), fname, false, false, false);
}